

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type * __thiscall
FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>_>::
fastAccessDx(FadBinaryDiv<Fad<Fad<double>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>_>
             *this,int i)

{
  undefined8 *in_RSI;
  Fad<Fad<double>_> *in_RDI;
  undefined4 in_stack_fffffffffffffed8;
  int in_stack_fffffffffffffedc;
  Fad<Fad<double>_> *this_00;
  Fad<double> *in_stack_ffffffffffffff10;
  Fad<double> *in_stack_ffffffffffffff18;
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  *in_stack_ffffffffffffff28;
  Fad<double> *in_stack_ffffffffffffff30;
  
  this_00 = in_RDI;
  Fad<Fad<double>_>::fastAccessDx(in_RDI,in_stack_fffffffffffffedc);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>::val
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>::fastAccessDx
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_> *)this_00,
             (int)((ulong)in_RDI >> 0x20));
  Fad<Fad<double>_>::val((Fad<Fad<double>_> *)*in_RSI);
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  operator-<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff18,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff10);
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>::val
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_>::val
            ((FadExpr<FadBinaryMinus<FadCst<double>,_Fad<Fad<double>_>_>_> *)
             CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
  operator*<Fad<double>,_Fad<double>,_nullptr>(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
  operator/<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_nullptr>
            ((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_stack_ffffffffffffff18,
             (FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_stack_ffffffffffffff10);
  Fad<double>::
  Fad<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>,FadExpr<FadBinaryMul<Fad<double>,Fad<double>>>>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryDiv<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_RDI);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
  Fad<double>::~Fad((Fad<double> *)in_RDI);
  Fad<double>::~Fad((Fad<double> *)in_RDI);
  FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
  ::~FadExpr((FadExpr<FadBinaryMinus<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>_>_>
              *)in_RDI);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
  Fad<double>::~Fad((Fad<double> *)in_RDI);
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
            ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)in_RDI);
  Fad<double>::~Fad((Fad<double> *)in_RDI);
  return (value_type *)this_00;
}

Assistant:

value_type fastAccessDx(int i) const { return (left_.fastAccessDx(i) * right_.val() - right_.fastAccessDx(i) * left_.val() ) 
					   / (right_.val() * right_.val()) ;}